

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

bp_delta_offsets_t *
duckdb::FSSTStorage::CalculateBpDeltaOffsets
          (bp_delta_offsets_t *__return_storage_ptr__,int64_t last_known_row,idx_t start,
          idx_t scan_count)

{
  unsigned_long uVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  
  uVar3 = last_known_row + 1;
  __return_storage_ptr__->delta_decode_start_row = uVar3;
  uVar4 = (ulong)((uint)uVar3 & 0x1f);
  __return_storage_ptr__->bitunpack_alignment_offset = uVar4;
  iVar2 = start - uVar3;
  __return_storage_ptr__->bitunpack_start_row = uVar3 & 0xffffffffffffffe0;
  __return_storage_ptr__->unused_delta_decoded_values = iVar2;
  iVar5 = uVar4 + iVar2;
  __return_storage_ptr__->scan_offset = iVar5;
  __return_storage_ptr__->total_delta_decode_count = iVar2 + scan_count;
  iVar5 = iVar5 + scan_count;
  if ((iVar5 & 0x1f) != 0) {
    uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)iVar5 & 0x1f);
    iVar5 = (iVar5 - uVar1) + 0x20;
  }
  __return_storage_ptr__->total_bitunpack_count = iVar5;
  return __return_storage_ptr__;
}

Assistant:

bp_delta_offsets_t FSSTStorage::CalculateBpDeltaOffsets(int64_t last_known_row, idx_t start, idx_t scan_count) {
	D_ASSERT((idx_t)(last_known_row + 1) <= start);
	bp_delta_offsets_t result;

	result.delta_decode_start_row = (idx_t)(last_known_row + 1);
	result.bitunpack_alignment_offset =
	    result.delta_decode_start_row % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
	result.bitunpack_start_row = result.delta_decode_start_row - result.bitunpack_alignment_offset;
	result.unused_delta_decoded_values = start - result.delta_decode_start_row;
	result.scan_offset = result.bitunpack_alignment_offset + result.unused_delta_decoded_values;
	result.total_delta_decode_count = scan_count + result.unused_delta_decoded_values;
	result.total_bitunpack_count =
	    BitpackingPrimitives::RoundUpToAlgorithmGroupSize<idx_t>(scan_count + result.scan_offset);

	D_ASSERT(result.total_delta_decode_count + result.bitunpack_alignment_offset <= result.total_bitunpack_count);
	return result;
}